

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hh
# Opt level: O3

void __thiscall
TokenSplit::tagLabel(TokenSplit *this,char *ptr,syntax_highlight h,AddrSpace *s,uintb o)

{
  char *pcVar1;
  
  pcVar1 = (char *)(this->tok)._M_string_length;
  strlen(ptr);
  std::__cxx11::string::_M_replace((ulong)&this->tok,0,pcVar1,(ulong)ptr);
  this->size = (int4)(this->tok)._M_string_length;
  (this->ptr_second).spc = s;
  this->off = o;
  this->tagtype = label_t;
  this->delimtype = tokenstring;
  this->hl = h;
  return;
}

Assistant:

void tagLabel(const char *ptr,EmitXml::syntax_highlight h,
		 const AddrSpace *s,uintb o) {
    tok = ptr; size = tok.size(); ptr_second.spc=s; off=o;
    tagtype=label_t; delimtype=tokenstring; hl=h; }